

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O2

void __thiscall
gui::Signal<gui::Widget_*,_const_sf::String_&>::emit
          (Signal<gui::Widget_*,_const_sf::String_&> *this,Widget *funcArgs,String *funcArgs_1)

{
  _Base_ptr p_Var1;
  
  if (this->enabled_ == true) {
    for (p_Var1 = (this->callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->callbacks_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      if (*(int *)&p_Var1[2]._M_parent == 0) {
        std::function<void_(gui::Widget_*,_const_sf::String_&)>::operator()
                  ((function<void_(gui::Widget_*,_const_sf::String_&)> *)&p_Var1[1]._M_parent,
                   funcArgs,funcArgs_1);
      }
      else {
        std::function<void_()>::operator()((function<void_()> *)&p_Var1[1]._M_parent);
      }
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }